

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configfile.cpp
# Opt level: O0

void __thiscall FConfigFile::FConfigFile(FConfigFile *this,FConfigFile *other)

{
  char *pathname;
  FConfigFile *other_local;
  FConfigFile *this_local;
  
  this->_vptr_FConfigFile = (_func_int **)&PTR__FConfigFile_00b69410;
  FString::FString(&this->PathName);
  this->CurrentSection = (FConfigSection *)0x0;
  this->Sections = (FConfigSection *)0x0;
  this->LastSectionPtr = &this->Sections;
  this->CurrentEntry = (FConfigEntry *)0x0;
  pathname = FString::operator_cast_to_char_(&other->PathName);
  ChangePathName(this,pathname);
  operator=(this,other);
  this->OkayToWrite = (bool)(other->OkayToWrite & 1);
  this->FileExisted = (bool)(other->FileExisted & 1);
  return;
}

Assistant:

FConfigFile::FConfigFile (const FConfigFile &other)
{
	Sections = CurrentSection = NULL;
	LastSectionPtr = &Sections;
	CurrentEntry = NULL;
	ChangePathName (other.PathName);
	*this = other;
	OkayToWrite = other.OkayToWrite;
	FileExisted = other.FileExisted;
}